

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path.c
# Opt level: O3

size_t portability_path_join
                 (char *left_path,size_t left_path_size,char *right_path,size_t right_path_size,
                 char *join_path,size_t join_size)

{
  ulong __n;
  ulong uVar1;
  long lVar2;
  size_t __n_00;
  
  if (join_path == (char *)0x0 || (right_path == (char *)0x0 || left_path == (char *)0x0)) {
    uVar1 = 0;
  }
  else {
    if (left_path_size < 2) {
      __n = 0;
    }
    else {
      lVar2 = (ulong)(*right_path == '/') + (ulong)(left_path[left_path_size - 2] == '/');
      __n = left_path_size - lVar2;
      if (join_size <= __n) {
        __n = join_size;
      }
      memcpy(join_path,left_path,__n);
      if (lVar2 == 0) {
        join_path[__n - 1] = '/';
      }
    }
    if (right_path_size < 2) {
      uVar1 = __n + 1;
      if (join_size < uVar1) {
        join_path[__n - 1] = '\0';
        uVar1 = __n;
      }
      else {
        join_path[__n] = '\0';
      }
    }
    else {
      __n_00 = join_size - __n;
      if (__n + right_path_size <= join_size) {
        __n_00 = right_path_size;
      }
      memcpy(join_path + __n,right_path,__n_00);
      uVar1 = __n + __n_00;
    }
  }
  return uVar1;
}

Assistant:

size_t portability_path_join(const char *left_path, size_t left_path_size, const char *right_path, size_t right_path_size, char *join_path, size_t join_size)
{
	if (left_path == NULL || right_path == NULL || join_path == NULL)
	{
		return 0;
	}

	size_t size = 0;

	if (left_path_size > 1)
	{
		size_t trailing_size = PORTABILITY_PATH_SEPARATOR(left_path[left_path_size - 2]) + PORTABILITY_PATH_SEPARATOR(right_path[0]);

		size += left_path_size - trailing_size;

		if (size > join_size)
		{
			size = join_size;
		}

		memcpy(join_path, left_path, size);

		if (trailing_size == 0)
		{
			join_path[size - 1] = PORTABILITY_PATH_SEPARATOR_C;
		}
	}

	if (right_path_size > 1)
	{
		if (size + right_path_size > join_size)
		{
			right_path_size = join_size - size;
		}

		memcpy(&join_path[size], right_path, right_path_size);

		size += right_path_size;
	}
	else
	{
		if (size + 1 > join_size)
		{
			join_path[size - 1] = '\0';
		}
		else
		{
			join_path[size++] = '\0';
		}
	}

	return size;
}